

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O2

string * __thiscall
glcts::PipelineStatisticsQueryUtilities::getStringForDrawCallType_abi_cxx11_
          (string *__return_storage_ptr__,PipelineStatisticsQueryUtilities *this,
          _draw_call_type draw_call_type)

{
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"[?]",&local_19);
  if ((uint)this < 0xc) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PipelineStatisticsQueryUtilities::getStringForDrawCallType(_draw_call_type draw_call_type)
{
	std::string result = "[?]";

	switch (draw_call_type)
	{
	case DRAW_CALL_TYPE_GLDRAWARRAYS:
		result = "glDrawArrays()";
		break;
	case DRAW_CALL_TYPE_GLDRAWARRAYSINDIRECT:
		result = "glDrawArraysIndirect()";
		break;
	case DRAW_CALL_TYPE_GLDRAWARRAYSINSTANCED:
		result = "glDrawArraysInstanced()";
		break;
	case DRAW_CALL_TYPE_GLDRAWARRAYSINSTANCEDBASEINSTANCE:
		result = "glDrawArraysInstancedBaseInstance()";
		break;
	case DRAW_CALL_TYPE_GLDRAWELEMENTS:
		result = "glDrawElements()";
		break;
	case DRAW_CALL_TYPE_GLDRAWELEMENTSBASEVERTEX:
		result = "glDrawElementsBaseVertex()";
		break;
	case DRAW_CALL_TYPE_GLDRAWELEMENTSINDIRECT:
		result = "glDrawElementsIndirect()";
		break;
	case DRAW_CALL_TYPE_GLDRAWELEMENTSINSTANCED:
		result = "glDrawElementsInstanced()";
		break;
	case DRAW_CALL_TYPE_GLDRAWELEMENTSINSTANCEDBASEINSTANCE:
		result = "glDrawElementsInstancedBaseInstance()";
		break;
	case DRAW_CALL_TYPE_GLDRAWELEMENTSINSTANCEDBASEVERTEXBASEINSTANCE:
		result = "glDrawElementsInstancedBaseVertexBaseInstance()";
		break;
	case DRAW_CALL_TYPE_GLDRAWRANGEELEMENTS:
		result = "glDrawRangeElements()";
		break;
	case DRAW_CALL_TYPE_GLDRAWRANGEELEMENTSBASEVERTEX:
		result = "glDrawRangeElementsBaseVertex()";
		break;
	default:
		DE_ASSERT(0);
		break;
	}

	return result;
}